

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O0

void jpgd::Row<1>::idct(int *pTemp,jpgd_block_t *pSrc)

{
  int iVar1;
  int dcval;
  jpgd_block_t *pSrc_local;
  int *pTemp_local;
  
  iVar1 = (int)*pSrc << 2;
  *pTemp = iVar1;
  pTemp[1] = iVar1;
  pTemp[2] = iVar1;
  pTemp[3] = iVar1;
  pTemp[4] = iVar1;
  pTemp[5] = iVar1;
  pTemp[6] = iVar1;
  pTemp[7] = iVar1;
  return;
}

Assistant:

static void idct(int* pTemp, const jpgd_block_t* pSrc) {
    const int dcval = (pSrc[0] << PASS1_BITS);

    pTemp[0] = dcval;
    pTemp[1] = dcval;
    pTemp[2] = dcval;
    pTemp[3] = dcval;
    pTemp[4] = dcval;
    pTemp[5] = dcval;
    pTemp[6] = dcval;
    pTemp[7] = dcval;
  }